

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O0

void __thiscall Assimp::D3DS::Mesh::Mesh(Mesh *this,string *name)

{
  string *name_local;
  Mesh *this_local;
  
  MeshWithSmoothingGroups<Assimp::D3DS::Face>::MeshWithSmoothingGroups
            (&this->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>);
  std::__cxx11::string::string((string *)&this->mName,(string *)name);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector(&this->mTexCoords);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->mFaceMaterials);
  aiMatrix4x4t<float>::aiMatrix4x4t(&this->mMat);
  return;
}

Assistant:

explicit Mesh(const std::string &name)
    : mName(name)
    {
    }